

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

FBaseCVar * FindCVarSub(char *var_name,int namelen)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  FBaseCVar *pFVar3;
  
  if (var_name == (char *)0x0) {
LAB_0047ad90:
    pFVar3 = (FBaseCVar *)0x0;
  }
  else {
    pFVar3 = CVars;
    do {
      if (pFVar3 == (FBaseCVar *)0x0) goto LAB_0047ad90;
      __s1 = pFVar3->Name;
      iVar2 = strncasecmp(__s1,var_name,(long)namelen);
      if ((iVar2 == 0) && (__s1[namelen] == '\0')) {
        bVar1 = false;
      }
      else {
        pFVar3 = pFVar3->m_Next;
        bVar1 = true;
      }
    } while (bVar1);
  }
  return pFVar3;
}

Assistant:

FBaseCVar *FindCVarSub (const char *var_name, int namelen)
{
	FBaseCVar *var;

	if (var_name == NULL)
		return NULL;

	var = CVars;
	while (var)
	{
		const char *probename = var->GetName ();

		if (strnicmp (probename, var_name, namelen) == 0 &&
			probename[namelen] == 0)
		{
			break;
		}
		var = var->m_Next;
	}
	return var;
}